

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.c
# Opt level: O0

int ly_write_skipped(lyout *out,size_t position,char *buf,size_t count)

{
  LYOUT_TYPE LVar1;
  int iVar2;
  size_t local_30;
  size_t count_local;
  char *buf_local;
  size_t position_local;
  lyout *out_local;
  
  LVar1 = out->type;
  local_30 = count;
  if (LYOUT_STREAM < LVar1) {
    if (LVar1 == LYOUT_MEMORY) {
      memcpy((void *)((long)&((out->method).f)->_flags + position),buf,count);
      goto LAB_001acb52;
    }
    if (LVar1 != LYOUT_CALLBACK) goto LAB_001acb52;
  }
  if (out->buf_len < position + count) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/printer.c"
           ,0x107);
    return -1;
  }
  memcpy(out->buffered + position,buf,count);
  out->hole_count = out->hole_count - 1;
  if (out->hole_count == 0) {
    iVar2 = ly_write(out,out->buffered,out->buf_len);
    local_30 = (size_t)iVar2;
    out->buf_len = 0;
  }
LAB_001acb52:
  return (int)local_30;
}

Assistant:

int
ly_write_skipped(struct lyout *out, size_t position, const char *buf, size_t count)
{
    switch (out->type) {
    case LYOUT_MEMORY:
        /* write */
        memcpy(&out->method.mem.buf[position], buf, count);
        break;
    case LYOUT_FD:
    case LYOUT_STREAM:
    case LYOUT_CALLBACK:
        if (out->buf_len < position + count) {
            LOGINT(NULL);
            return -1;
        }

        /* write into the hole */
        memcpy(&out->buffered[position], buf, count);

        /* decrease hole counter */
        --out->hole_count;

        if (!out->hole_count) {
            /* all holes filled, we can write the buffer */
            count = ly_write(out, out->buffered, out->buf_len);
            out->buf_len = 0;
        }
        break;
    }

    return count;
}